

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_note.cpp
# Opt level: O1

void __thiscall BmsNoteManager::FixIncorrectLongNote(BmsNoteManager *this)

{
  _Rb_tree_color bar;
  undefined1 *puVar1;
  mapped_type *pmVar2;
  _Base_ptr p_Var3;
  _Rb_tree<int,_std::pair<const_int,_BmsNote>,_std::_Select1st<std::pair<const_int,_BmsNote>_>,_std::less<int>,_std::allocator<std::pair<const_int,_BmsNote>_>_>
  *this_00;
  long lVar4;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_BmsNote>_>,_std::_Rb_tree_iterator<std::pair<const_int,_BmsNote>_>_>
  pVar5;
  bool isln [20];
  BmsNote _tmp;
  set<int,_std::less<int>,_std::allocator<int>_> notemap;
  _Rb_tree_color local_ac;
  char local_a8 [32];
  _Rb_tree<int,_std::pair<const_int,_BmsNote>,_std::_Select1st<std::pair<const_int,_BmsNote>_>,_std::less<int>,_std::allocator<std::pair<const_int,_BmsNote>_>_>
  *local_88;
  BmsNote local_80;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  lVar4 = 0;
  local_a8[0x10] = '\0';
  local_a8[0x11] = '\0';
  local_a8[0x12] = '\0';
  local_a8[0x13] = '\0';
  local_a8[0] = '\0';
  local_a8[1] = '\0';
  local_a8[2] = '\0';
  local_a8[3] = '\0';
  local_a8[4] = '\0';
  local_a8[5] = '\0';
  local_a8[6] = '\0';
  local_a8[7] = '\0';
  local_a8[8] = '\0';
  local_a8[9] = '\0';
  local_a8[10] = '\0';
  local_a8[0xb] = '\0';
  local_a8[0xc] = '\0';
  local_a8[0xd] = '\0';
  local_a8[0xe] = '\0';
  local_a8[0xf] = '\0';
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    BmsNoteLane::GetNoteExistBar
              ((BmsNoteLane *)(&this->lanes_[0].notes_ + lVar4),
               (set<int,_std::less<int>,_std::allocator<int>_> *)&local_60);
    lVar4 = lVar4 + 0x30;
  } while (lVar4 != 0x3c0);
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_60._M_impl.super__Rb_tree_header) {
    p_Var3 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    local_88 = (_Rb_tree<int,_std::pair<const_int,_BmsNote>,_std::_Select1st<std::pair<const_int,_BmsNote>_>,_std::less<int>,_std::allocator<std::pair<const_int,_BmsNote>_>_>
                *)this;
    do {
      bar = p_Var3[1]._M_color;
      lVar4 = 0;
      this_00 = local_88;
      do {
        BmsNoteLane::Get(&local_80,(BmsNoteLane *)this_00,bar);
        if (local_80.type == 3) {
          if (local_a8[lVar4] == '\0') {
            puVar1 = (undefined1 *)std::_Rb_tree_increment(p_Var3);
            local_80.type =
                 ((_Rb_tree_header *)puVar1 != &local_60._M_impl.super__Rb_tree_header) + 1;
            local_ac = bar;
            pmVar2 = std::
                     map<int,_BmsNote,_std::less<int>,_std::allocator<std::pair<const_int,_BmsNote>_>_>
                     ::operator[]((map<int,_BmsNote,_std::less<int>,_std::allocator<std::pair<const_int,_BmsNote>_>_>
                                   *)this_00,(key_type *)&local_ac);
            *(ulong *)&pmVar2->field_0xc = CONCAT44(local_80.pos._0_4_,local_80._12_4_);
            *(undefined8 *)((long)&pmVar2->pos + 4) = local_80._20_8_;
            pmVar2->type = local_80.type;
            pmVar2->value = (BmsWord)local_80.value.value_;
            *(ulong *)&pmVar2->time = CONCAT44(local_80._12_4_,local_80.time);
          }
          local_a8[lVar4] = '\0';
        }
        else if (local_80.type == 2) {
          if (local_a8[lVar4] == '\x01') {
            local_ac = bar;
            pVar5 = std::
                    _Rb_tree<int,_std::pair<const_int,_BmsNote>,_std::_Select1st<std::pair<const_int,_BmsNote>_>,_std::less<int>,_std::allocator<std::pair<const_int,_BmsNote>_>_>
                    ::equal_range(this_00,(key_type *)&local_ac);
            std::
            _Rb_tree<int,_std::pair<const_int,_BmsNote>,_std::_Select1st<std::pair<const_int,_BmsNote>_>,_std::less<int>,_std::allocator<std::pair<const_int,_BmsNote>_>_>
            ::_M_erase_aux(this_00,(_Base_ptr)pVar5.first._M_node,(_Base_ptr)pVar5.second._M_node);
          }
          local_a8[lVar4] = '\x01';
        }
        BmsWord::~BmsWord(&local_80.value);
        lVar4 = lVar4 + 1;
        this_00 = this_00 + 0x30;
      } while (lVar4 != 0x14);
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != &local_60._M_impl.super__Rb_tree_header);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  return;
}

Assistant:

void BmsNoteManager::FixIncorrectLongNote() {
	// there's may be 2 cases -
	// - LN_START after LN_START / LN_END after LN_END
	// - NORMAL_NOTE during LN
	// first case must be fixed.
	// second case well.. removing note isn't solution because keysound will be deleted.
	// (you'll get miss if you don't hit not during LN... or act like HELLCHARGE note.)
	bool isln[20] = { false, };
	std::set<barindex> notemap;
	GetNoteExistBar(notemap);
	for (auto it = notemap.begin(); it != notemap.end(); ++it) {
		barindex bar = *it;
		for (int c = 0; c < 20; c++) {
			BmsNote _tmp = lanes_[c].Get(bar);
			/*
			 * case: LNSTART reached, but currently considered as longnote status
			 * solution: ignore current note
			 */
			if (_tmp.type == BmsNote::NOTE_LNSTART) {
				if (isln[c] == true) {
					lanes_[c].Delete(bar);
				}
				isln[c] = true;
			}
			/*
			 * case: LNEND reached, but current note wasn't longnote.
			 * solution: set NORMAL
			 */
			else if (_tmp.type == BmsNote::NOTE_LNEND) {
				if (isln[c] == false) {
					auto nextit = it;
					if (++nextit == notemap.end())
						_tmp.type = BmsNote::NOTE_NORMAL;
					else
						_tmp.type = BmsNote::NOTE_LNSTART;
					lanes_[c].Set(bar, _tmp);
				}
				isln[c] = false;
			}
		}
	}
}